

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

string * __thiscall
duckdb_parquet::to_string_abi_cxx11_(string *__return_storage_ptr__,duckdb_parquet *this,type *val)

{
  const_iterator cVar1;
  allocator local_1d;
  key_type_conflict4 local_1c;
  
  local_1c = *(key_type_conflict4 *)this;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                  *)_Encoding_VALUES_TO_NAMES,&local_1c);
  if (cVar1._M_node == (_Base_ptr)(_Encoding_VALUES_TO_NAMES + 8)) {
    std::__cxx11::to_string(__return_storage_ptr__,*(int *)this);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(char *)cVar1._M_node[1]._M_parent,&local_1d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Encoding::type& val) {
  std::map<int, const char*>::const_iterator it = _Encoding_VALUES_TO_NAMES.find(val);
  if (it != _Encoding_VALUES_TO_NAMES.end()) {
    return std::string(it->second);
  } else {
    return std::to_string(static_cast<int>(val));
  }
}